

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O1

void __thiscall RasterizerA3<16U>::clear(RasterizerA3<16U> *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long bitWord;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  Cell *pCVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    uVar1 = (this->_yBounds).start;
    uVar4 = (ulong)(int)uVar1;
    uVar2 = (this->_yBounds).end;
    if (uVar1 <= uVar2) {
      pCVar10 = this->_cells + this->_cellStride * uVar4;
      puVar11 = this->_bits + this->_bitStride * uVar4;
      do {
        sVar8 = this->_bitStride;
        uVar13 = 0;
        do {
          uVar7 = *puVar11;
          *puVar11 = 0;
          if (uVar7 != 0) {
            uVar12 = (ulong)(this->super_CellRasterizer).super_Rasterizer._width;
            if (uVar13 + 0x400 < uVar12) {
              uVar12 = uVar13 + 0x400;
            }
            do {
              lVar3 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar9 = -1L << ((byte)lVar3 & 0x3f);
              uVar6 = uVar9 ^ uVar7;
              uVar5 = (uint)((int)lVar3 << 4) | uVar13;
              if (uVar7 == uVar9) {
                uVar9 = uVar5 + 0x10;
                uVar7 = uVar6;
              }
              else {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                uVar7 = uVar6 ^ -1L << ((byte)lVar3 & 0x3f);
                uVar9 = (uint)((int)lVar3 << 4) | uVar13;
              }
              if (uVar12 <= uVar9) {
                uVar9 = uVar12;
              }
              memset(pCVar10 + uVar5,0,(uVar9 - uVar5) * 8);
            } while (uVar7 != 0);
          }
          uVar13 = uVar13 + 0x400;
          puVar11 = puVar11 + 1;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
        pCVar10 = pCVar10 + this->_cellStride;
        uVar4 = uVar4 + 1;
      } while (uVar4 <= (ulong)(long)(int)uVar2);
    }
    (this->_yBounds).start = 0x7fffffff;
    (this->_yBounds).end = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }